

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

void __thiscall
duckdb::TableIndexList::VerifyForeignKey
          (TableIndexList *this,optional_ptr<duckdb::LocalTableStorage,_true> storage,
          vector<duckdb::PhysicalIndex,_true> *fk_keys,DataChunk *chunk,
          ConflictManager *conflict_manager)

{
  VerifyExistenceType VVar1;
  int iVar2;
  LocalTableStorage *pLVar3;
  Index *pIVar4;
  undefined4 extraout_var;
  optional_ptr<duckdb::Index,_true> index;
  IndexAppendInfo index_append_info;
  optional_ptr<duckdb::Index,_true> local_48;
  optional_ptr<duckdb::LocalTableStorage,_true> local_40;
  undefined1 local_38 [8];
  BoundIndex *local_30;
  
  local_40.ptr = storage.ptr;
  VVar1 = ConflictManager::LookupType(conflict_manager);
  local_48 = FindForeignKeyIndex(this,fk_keys,VVar1 != APPEND_FK);
  if (storage.ptr == (LocalTableStorage *)0x0) {
    local_30 = (BoundIndex *)0x0;
  }
  else {
    pLVar3 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&local_40);
    pIVar4 = optional_ptr<duckdb::Index,_true>::operator->(&local_48);
    iVar2 = (*pIVar4->_vptr_Index[4])(pIVar4);
    local_30 = (BoundIndex *)Find(&pLVar3->delete_indexes,(string *)CONCAT44(extraout_var,iVar2));
  }
  local_38[0] = 0;
  pIVar4 = optional_ptr<duckdb::Index,_true>::operator->(&local_48);
  (*pIVar4->_vptr_Index[10])(pIVar4,chunk,local_38,conflict_manager);
  return;
}

Assistant:

void TableIndexList::VerifyForeignKey(optional_ptr<LocalTableStorage> storage, const vector<PhysicalIndex> &fk_keys,
                                      DataChunk &chunk, ConflictManager &conflict_manager) {
	auto fk_type = conflict_manager.LookupType() == VerifyExistenceType::APPEND_FK
	                   ? ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE
	                   : ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE;

	// Check whether the chunk can be inserted in or deleted from the referenced table storage.
	auto index = FindForeignKeyIndex(fk_keys, fk_type);
	D_ASSERT(index && index->IsBound());
	if (storage) {
		auto delete_index = storage->delete_indexes.Find(index->GetIndexName());
		IndexAppendInfo index_append_info(IndexAppendMode::DEFAULT, delete_index);
		index->Cast<BoundIndex>().VerifyConstraint(chunk, index_append_info, conflict_manager);
	} else {
		IndexAppendInfo index_append_info;
		index->Cast<BoundIndex>().VerifyConstraint(chunk, index_append_info, conflict_manager);
	}
}